

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O3

CLdispatchX * __thiscall CLIntercept::dispatchX(CLIntercept *this,cl_platform_id platform)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  key_type local_8;
  
  p_Var4 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if (*(cl_platform_id *)(p_Var4 + 1) >= platform) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(cl_platform_id *)(p_Var4 + 1) < platform];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (*(cl_platform_id *)(p_Var2 + 1) <= platform)) {
      return (CLdispatchX *)&p_Var2[1]._M_parent;
    }
  }
  local_8 = (key_type)0x0;
  pmVar3 = std::
           map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
           ::at(&this->m_DispatchX,&local_8);
  return pmVar3;
}

Assistant:

inline const CLdispatchX& CLIntercept::dispatchX( cl_platform_id platform ) const
{
    CLdispatchXMap::const_iterator iter = m_DispatchX.find(platform);
    if( iter != m_DispatchX.end() )
    {
        return iter->second;
    }
    else
    {
        return m_DispatchX.at(NULL);
    }
}